

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O0

value * helics::fileops::loadTomlStr(string *tomlString)

{
  string *in_RSI;
  value *in_RDI;
  string *in_stack_00000020;
  istream *in_stack_00000028;
  exception *se;
  istringstream tstring;
  value *doc;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1d8;
  allocator<char> local_1c1 [36];
  undefined1 local_19d;
  istringstream local_190 [400];
  
  std::__cxx11::istringstream::istringstream(local_190,in_RSI,_S_in);
  local_19d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(allocator<char> *)in_RDI);
  toml::spec::default_version();
  toml::parse<toml::type_config>(in_stack_00000028,in_stack_00000020,_se);
  std::__cxx11::string::~string(pbStack_1d8);
  std::allocator<char>::~allocator(local_1c1);
  local_19d = 1;
  std::__cxx11::istringstream::~istringstream(local_190);
  return in_RDI;
}

Assistant:

toml::value loadTomlStr(const std::string& tomlString)
{
    try {
        std::istringstream tstring(tomlString);
        toml::value doc = toml::parse(tstring);
        return doc;
    }
    catch (const toml::exception& se) {
        throw(std::invalid_argument(se.what()));
    }
}